

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_utils.cpp
# Opt level: O1

void amrex::FillSignedDistance(MultiFab *mf,bool fluid_has_positive_sign)

{
  EBFArrayBoxFactory *eb_factory;
  
  eb_factory = (EBFArrayBoxFactory *)
               __dynamic_cast((mf->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                              super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                              .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                              _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo,0);
  if (eb_factory != (EBFArrayBoxFactory *)0x0) {
    FillSignedDistance(mf,eb_factory->m_parent,eb_factory,1,fluid_has_positive_sign);
    return;
  }
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&mf->super_FabArray<amrex::FArrayBox>,1.79769313486232e+308,0,
             (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,
             &(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow);
  return;
}

Assistant:

void FillSignedDistance (MultiFab& mf, bool fluid_has_positive_sign)
{
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(&(mf.Factory()));
    if (factory) {
        FillSignedDistance(mf, *(factory->getEBLevel()), *factory, 1, fluid_has_positive_sign);
    } else {
        mf.setVal(std::numeric_limits<Real>::max());
    }
}